

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_hand.cc
# Opt level: O2

void __thiscall
hanabi_learning_env::HanabiHand::ValueKnowledge::ApplyIsValueHint(ValueKnowledge *this,int value)

{
  undefined8 uVar1;
  undefined4 uVar2;
  uint __line;
  _Bvector_impl *p_Var3;
  ulong in_RAX;
  ulong __n;
  char *__assertion;
  reference rVar4;
  _Bit_iterator __first;
  _Bit_iterator __last;
  undefined8 uStack_28;
  
  if ((value < 0) ||
     (__n = (ulong)(uint)value,
     (ulong)(this->value_plausible_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
     ((long)(this->value_plausible_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
     (long)(this->value_plausible_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <= __n)) {
    __assertion = "value >= 0 && value < value_plausible_.size()";
    __line = 0x1e;
  }
  else if (this->value_ == value || this->value_ < 0) {
    uStack_28 = in_RAX;
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->value_plausible_,__n);
    if ((*rVar4._M_p & rVar4._M_mask) != 0) {
      this->value_ = value;
      p_Var3 = &(this->value_plausible_).super__Bvector_base<std::allocator<bool>_>._M_impl;
      uVar1 = (p_Var3->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
      uVar2 = (p_Var3->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
      __last.super__Bit_iterator_base._M_offset = uVar2;
      __last.super__Bit_iterator_base._M_p = (_Bit_type *)uVar1;
      uStack_28 = uStack_28 & 0xffffffffffffff;
      __first.super__Bit_iterator_base._8_8_ = 0;
      __first.super__Bit_iterator_base._M_p =
           (this->value_plausible_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      __last.super__Bit_iterator_base._12_4_ = 0;
      std::__fill_a1(__first,__last,(bool *)((long)&uStack_28 + 7));
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->value_plausible_,__n);
      *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
      return;
    }
    __assertion = "value_plausible_[value] == true";
    __line = 0x20;
  }
  else {
    __assertion = "value_ < 0 || value_ == value";
    __line = 0x1f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_hand.cc"
                ,__line,
                "void hanabi_learning_env::HanabiHand::ValueKnowledge::ApplyIsValueHint(int)");
}

Assistant:

void HanabiHand::ValueKnowledge::ApplyIsValueHint(int value) {
  assert(value >= 0 && value < value_plausible_.size());
  assert(value_ < 0 || value_ == value);
  assert(value_plausible_[value] == true);
  value_ = value;
  std::fill(value_plausible_.begin(), value_plausible_.end(), false);
  value_plausible_[value] = true;
}